

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_linkedsectors.cpp
# Opt level: O3

bool P_AddSectorLinks(sector_t_conflict *control,int tag,INTBOOL ceiling,int movetype)

{
  uint uVar1;
  extsector_t *peVar2;
  FLinkedSector *pFVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  plane *scrollplane;
  long lVar10;
  FSectorTagIterator itr;
  FSectorTagIterator local_38;
  
  if (ceiling == 0) {
    bVar4 = sector_t::PlaneMoving(control,0);
    if (bVar4) {
      return false;
    }
  }
  else {
    bVar4 = sector_t::PlaneMoving(control,1);
    if (bVar4) {
      return false;
    }
  }
  uVar6 = (uint)((movetype & 5U) != 4) * 5 + 10 & movetype;
  uVar1 = uVar6 & 5;
  if ((movetype & 10U) != 8) {
    uVar1 = uVar6;
  }
  if ((movetype != 0) && (uVar1 == 0)) {
    return false;
  }
  bVar4 = ceiling != 0;
  peVar2 = control->e;
  scrollplane = &(peVar2->Linked).Floor + bVar4;
  if (uVar1 == 0) {
    uVar1 = (&(peVar2->Linked).Floor)[bVar4].Sectors.Count;
    uVar6 = uVar1 - 1;
    if ((int)uVar6 < 0) {
      return true;
    }
    iVar9 = -uVar1;
    lVar8 = (ulong)uVar1 << 4;
    lVar10 = (ulong)uVar6 << 4;
    uVar7 = (ulong)uVar6;
    do {
      bVar5 = FTagManager::SectorHasTag
                        (&tagManager,
                         *(sector_t **)((long)&((scrollplane->Sectors).Array)->Sector + lVar10),tag)
      ;
      if (((bVar5) && (uVar1 = (&(peVar2->Linked).Floor)[bVar4].Sectors.Count, uVar7 < uVar1)) &&
         ((&(peVar2->Linked).Floor)[bVar4].Sectors.Count = uVar1 - 1, uVar7 < uVar1 - 1)) {
        pFVar3 = (scrollplane->Sectors).Array;
        memmove((void *)((long)&pFVar3->Sector + lVar10),(void *)((long)&pFVar3->Sector + lVar8),
                (ulong)(uVar1 + iVar9) << 4);
      }
      iVar9 = iVar9 + 1;
      lVar8 = lVar8 + -0x10;
      lVar10 = lVar10 + -0x10;
      bVar5 = 0 < (long)uVar7;
      uVar7 = uVar7 - 1;
    } while (bVar5);
  }
  else {
    if (tag == 0) {
      local_38.start = 0;
    }
    else {
      local_38.start = tagManager.TagHashFirst[(ulong)(uint)tag & 0xff];
    }
    local_38.searchtag = tag;
    uVar6 = FSectorTagIterator::Next(&local_38);
    while (-1 < (int)uVar6) {
      if (sectors + uVar6 != control) {
        AddSingleSector(scrollplane,sectors + uVar6,uVar1);
      }
      uVar6 = FSectorTagIterator::Next(&local_38);
    }
  }
  return true;
}

Assistant:

bool P_AddSectorLinks(sector_t *control, int tag, INTBOOL ceiling, int movetype)
{
	int param = movetype;

	// can't be done if the control sector is moving.
	if ((ceiling && control->PlaneMoving(sector_t::ceiling)) || 
		(!ceiling && control->PlaneMoving(sector_t::floor))) return false;

	// Make sure we have only valid combinations
	movetype &= LINK_FLAGMASK;
	if ((movetype & LINK_FLOORMIRROR) == LINK_FLOORMIRRORFLAG) movetype &= ~LINK_FLOORMIRRORFLAG;
	if ((movetype & LINK_CEILINGMIRROR) == LINK_CEILINGMIRRORFLAG) movetype &= ~LINK_CEILINGMIRRORFLAG;

	// Don't remove any sector if the parameter is invalid.
	// Addition may still be performed based on the given value.
	if (param != 0 && movetype == 0) return false;

	extsector_t::linked::plane &scrollplane = ceiling? control->e->Linked.Ceiling : control->e->Linked.Floor;

	if (movetype > 0)
	{
		int sec;
		FSectorTagIterator itr(tag);
		while ((sec = itr.Next()) >= 0)
		{
			// Don't attach to self!
			if (control != &sectors[sec])
			{
				AddSingleSector(scrollplane, &sectors[sec], movetype);
			}
		}
	}
	else
	{
		RemoveTaggedSectors(scrollplane, tag);
	}
	return true;
}